

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UnicodeString *
icu_63::TimeZone::getWindowsID(UnicodeString *id,UnicodeString *winid,UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  UBool UVar4;
  int8_t iVar5;
  ushort uVar6;
  UResType UVar7;
  UResourceBundle *pUVar8;
  UChar *pUVar9;
  UChar *pUVar10;
  char *src;
  undefined4 length;
  UChar *pUVar11;
  UErrorCode *status_00;
  UChar *pUVar12;
  UBool isSystemID;
  int32_t len;
  UnicodeString canonicalID;
  UBool local_e1;
  UResourceBundle *local_e0;
  UResourceBundle *local_d8;
  UErrorCode *local_d0;
  int local_c4;
  UChar *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  uVar1 = (winid->fUnion).fStackFields.fLengthAndFlags;
  uVar6 = 2;
  if ((uVar1 & 1) == 0) {
    uVar6 = uVar1 & 0x1e;
  }
  (winid->fUnion).fStackFields.fLengthAndFlags = uVar6;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_e1 = '\0';
    getCanonicalID(id,&local_b0,&local_e1,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (local_e1 != '\0')) {
      pUVar8 = ures_openDirect_63((char *)0x0,"windowsZones",status);
      ures_getByKey_63(pUVar8,"mapTimezones",pUVar8,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_e0 = (UResourceBundle *)0x0;
        bVar2 = false;
        local_d8 = pUVar8;
        local_d0 = status;
LAB_001f94ab:
        while (((UVar4 = ures_hasNext_63(local_d8), !bVar2 && (UVar4 != '\0')) &&
               (local_e0 = ures_getNextResource_63(local_d8,local_e0,status),
               *status < U_ILLEGAL_ARGUMENT_ERROR))) {
          UVar7 = ures_getType_63(local_e0);
          bVar2 = false;
          if (UVar7 == RES_TABLE) {
            pUVar8 = (UResourceBundle *)0x0;
            status_00 = status;
            bVar3 = false;
LAB_001f9501:
            do {
              do {
                bVar2 = bVar3;
                UVar4 = ures_hasNext_63(local_e0);
                status = status_00;
                if (((bVar2) || (UVar4 == '\0')) ||
                   (pUVar8 = ures_getNextResource_63(local_e0,pUVar8,status_00),
                   U_ZERO_ERROR < *status_00)) goto LAB_001f961e;
                UVar7 = ures_getType_63(pUVar8);
                bVar3 = false;
              } while (UVar7 != RES_STRING);
              pUVar9 = ures_getString_63(pUVar8,&local_c4,status_00);
              pUVar11 = pUVar9;
              status = local_d0;
              if (U_ZERO_ERROR < *status_00) goto LAB_001f961e;
              do {
                pUVar10 = u_strchr_63(pUVar11,L' ');
                pUVar12 = pUVar9 + local_c4;
                if (pUVar10 != (UChar *)0x0) {
                  pUVar12 = pUVar10;
                }
                length = local_b0.fUnion.fFields.fLength;
                if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                  length = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                iVar5 = UnicodeString::doCompare
                                  (&local_b0,0,length,pUVar11,0,
                                   (int32_t)((ulong)((long)pUVar12 - (long)pUVar11) >> 1));
                local_c0 = pUVar11;
                if (iVar5 == '\0') {
                  src = ures_getKey_63(local_e0);
                  UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
                  UnicodeString::moveFrom(winid,&local_70);
                  UnicodeString::~UnicodeString(&local_70);
                  status_00 = local_d0;
                  bVar3 = true;
                  goto LAB_001f9501;
                }
                pUVar11 = pUVar12 + 1;
              } while (pUVar10 != (UChar *)0x0);
              status_00 = local_d0;
              bVar3 = false;
            } while( true );
          }
        }
        pUVar8 = local_d8;
        ures_close_63(local_e0);
        ures_close_63(pUVar8);
      }
    }
    else if (*status == U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_ZERO_ERROR;
    }
    UnicodeString::~UnicodeString(&local_b0);
  }
  return winid;
LAB_001f961e:
  ures_close_63(pUVar8);
  goto LAB_001f94ab;
}

Assistant:

UnicodeString&
TimeZone::getWindowsID(const UnicodeString& id, UnicodeString& winid, UErrorCode& status) {
    winid.remove();
    if (U_FAILURE(status)) {
        return winid;
    }

    // canonicalize the input ID
    UnicodeString canonicalID;
    UBool isSystemID = FALSE;

    getCanonicalID(id, canonicalID, isSystemID, status);
    if (U_FAILURE(status) || !isSystemID) {
        // mapping data is only applicable to tz database IDs
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            // getWindowsID() sets an empty string where
            // getCanonicalID() sets a U_ILLEGAL_ARGUMENT_ERROR.
            status = U_ZERO_ERROR;
        }
        return winid;
    }

    UResourceBundle *mapTimezones = ures_openDirect(NULL, "windowsZones", &status);
    ures_getByKey(mapTimezones, "mapTimezones", mapTimezones, &status);

    if (U_FAILURE(status)) {
        return winid;
    }

    UResourceBundle *winzone = NULL;
    UBool found = FALSE;
    while (ures_hasNext(mapTimezones) && !found) {
        winzone = ures_getNextResource(mapTimezones, winzone, &status);
        if (U_FAILURE(status)) {
            break;
        }
        if (ures_getType(winzone) != URES_TABLE) {
            continue;
        }
        UResourceBundle *regionalData = NULL;
        while (ures_hasNext(winzone) && !found) {
            regionalData = ures_getNextResource(winzone, regionalData, &status);
            if (U_FAILURE(status)) {
                break;
            }
            if (ures_getType(regionalData) != URES_STRING) {
                continue;
            }
            int32_t len;
            const UChar *tzids = ures_getString(regionalData, &len, &status);
            if (U_FAILURE(status)) {
                break;
            }

            const UChar *start = tzids;
            UBool hasNext = TRUE;
            while (hasNext) {
                const UChar *end = u_strchr(start, (UChar)0x20);
                if (end == NULL) {
                    end = tzids + len;
                    hasNext = FALSE;
                }
                if (canonicalID.compare(start, static_cast<int32_t>(end - start)) == 0) {
                    winid = UnicodeString(ures_getKey(winzone), -1 , US_INV);
                    found = TRUE;
                    break;
                }
                start = end + 1;
            }
        }
        ures_close(regionalData);
    }
    ures_close(winzone);
    ures_close(mapTimezones);

    return winid;
}